

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3VdbeMemSetStr(Mem *pMem,char *z,int n,u8 enc,_func_void_void_ptr *xDel)

{
  byte *pbVar1;
  char cVar2;
  char cVar3;
  sqlite3 *psVar4;
  uint uVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  size_t sVar10;
  void *pvVar11;
  u8 uVar12;
  int iVar13;
  u16 uVar14;
  uint uVar15;
  ulong uVar16;
  
  if (z == (char *)0x0) {
    if ((pMem->flags & 0x2460) == 0) {
      pMem->flags = 1;
    }
    else {
      vdbeMemClearExternAndSetNull(pMem);
    }
    return 0;
  }
  if (pMem->db == (sqlite3 *)0x0) {
    iVar13 = 1000000000;
  }
  else {
    iVar13 = pMem->db->aLimit[0];
  }
  uVar15 = 2;
  if (enc == '\0') {
    uVar15 = 0x10;
  }
  if (n < 0) {
    if (enc == '\x01') {
      sVar10 = strlen(z);
      uVar7 = (uint)sVar10 & 0x3fffffff;
      uVar5 = iVar13 + 1;
      if ((int)uVar7 <= iVar13) {
        uVar5 = uVar7;
      }
      uVar16 = (ulong)uVar5;
    }
    else {
      uVar16 = 0;
      if (-1 < iVar13) {
        do {
          if (z[uVar16 + 1] == '\0' && z[uVar16] == '\0') break;
          uVar16 = uVar16 + 2;
        } while ((int)uVar16 <= iVar13);
      }
    }
    n = (int)uVar16;
    uVar15 = uVar15 | 0x200;
  }
  uVar14 = (u16)uVar15;
  if (xDel != (_func_void_void_ptr *)0xffffffffffffffff) {
    if (xDel == sqlite3MallocSize) {
      if (((pMem->flags & 0x2460) != 0) || (pMem->szMalloc != 0)) {
        vdbeMemClear(pMem);
      }
      pMem->z = z;
      pMem->zMalloc = z;
      psVar4 = pMem->db;
      if (((psVar4 == (sqlite3 *)0x0) || (z < (psVar4->lookaside).pStart)) ||
         ((psVar4->lookaside).pEnd <= z)) {
        uVar15 = (*sqlite3Config.m.xSize)(z);
      }
      else {
        uVar15 = (uint)(psVar4->lookaside).sz;
      }
      pMem->szMalloc = uVar15;
    }
    else {
      if (((pMem->flags & 0x2460) != 0) || (pMem->szMalloc != 0)) {
        vdbeMemClear(pMem);
      }
      pMem->z = z;
      pMem->xDel = xDel;
      uVar14 = (ushort)(xDel == (_func_void_void_ptr *)0x0) * 0x400 + uVar14 + 0x400;
    }
    goto LAB_001f1af7;
  }
  bVar6 = false;
  iVar9 = (enc != '\x01') + 1;
  if (uVar15 >> 9 == 0) {
    iVar9 = 0;
  }
  if (iVar13 < n) {
    iVar9 = 0x12;
  }
  else {
    iVar9 = iVar9 + n;
    iVar8 = 0x20;
    if (0x20 < iVar9) {
      iVar8 = iVar9;
    }
    if (pMem->szMalloc < iVar8) {
      bVar6 = false;
      iVar8 = sqlite3VdbeMemGrow(pMem,iVar8,0);
      if (iVar8 != 0) {
        iVar9 = 7;
        goto LAB_001f1aea;
      }
    }
    else {
      pMem->z = pMem->zMalloc;
      pMem->flags = pMem->flags & 0xd;
    }
    pvVar11 = memcpy(pMem->z,z,(long)iVar9);
    iVar9 = (int)pvVar11;
    bVar6 = true;
  }
LAB_001f1aea:
  if (!bVar6) {
    return iVar9;
  }
LAB_001f1af7:
  pMem->n = n;
  pMem->flags = uVar14;
  uVar12 = '\x01';
  if (1 < enc) {
    uVar12 = enc;
  }
  pMem->enc = uVar12;
  if (1 < enc) {
    if (n < 2) {
      uVar12 = '\0';
    }
    else {
      cVar2 = *pMem->z;
      cVar3 = pMem->z[1];
      uVar12 = '\x02';
      if (cVar3 != -2 || cVar2 != -1) {
        uVar12 = (cVar3 == -1 && cVar2 == -2) * '\x03';
      }
    }
    if (uVar12 != '\0') {
      iVar9 = sqlite3VdbeMemMakeWriteable(pMem);
      if (iVar9 != 0) {
        return 7;
      }
      sVar10 = (long)pMem->n - 2;
      pMem->n = (int)sVar10;
      memmove(pMem->z,pMem->z + 2,sVar10);
      pMem->z[pMem->n] = '\0';
      pMem->z[(long)pMem->n + 1] = '\0';
      pbVar1 = (byte *)((long)&pMem->flags + 1);
      *pbVar1 = *pbVar1 | 2;
      pMem->enc = uVar12;
    }
  }
  iVar9 = 0x12;
  if (n <= iVar13) {
    iVar9 = 0;
  }
  return iVar9;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemSetStr(
  Mem *pMem,          /* Memory cell to set to string value */
  const char *z,      /* String pointer */
  int n,              /* Bytes in string, or negative */
  u8 enc,             /* Encoding of z.  0 for BLOBs */
  void (*xDel)(void*) /* Destructor function */
){
  int nByte = n;      /* New value for pMem->n */
  int iLimit;         /* Maximum allowed string or blob size */
  u16 flags = 0;      /* New value for pMem->flags */

  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( (pMem->flags & MEM_RowSet)==0 );

  /* If z is a NULL pointer, set pMem to contain an SQL NULL. */
  if( !z ){
    sqlite3VdbeMemSetNull(pMem);
    return SQLITE_OK;
  }

  if( pMem->db ){
    iLimit = pMem->db->aLimit[SQLITE_LIMIT_LENGTH];
  }else{
    iLimit = SQLITE_MAX_LENGTH;
  }
  flags = (enc==0?MEM_Blob:MEM_Str);
  if( nByte<0 ){
    assert( enc!=0 );
    if( enc==SQLITE_UTF8 ){
      nByte = sqlite3Strlen30(z);
      if( nByte>iLimit ) nByte = iLimit+1;
    }else{
      for(nByte=0; nByte<=iLimit && (z[nByte] | z[nByte+1]); nByte+=2){}
    }
    flags |= MEM_Term;
  }

  /* The following block sets the new values of Mem.z and Mem.xDel. It
  ** also sets a flag in local variable "flags" to indicate the memory
  ** management (one of MEM_Dyn or MEM_Static).
  */
  if( xDel==SQLITE_TRANSIENT ){
    int nAlloc = nByte;
    if( flags&MEM_Term ){
      nAlloc += (enc==SQLITE_UTF8?1:2);
    }
    if( nByte>iLimit ){
      return SQLITE_TOOBIG;
    }
    testcase( nAlloc==0 );
    testcase( nAlloc==31 );
    testcase( nAlloc==32 );
    if( sqlite3VdbeMemClearAndResize(pMem, MAX(nAlloc,32)) ){
      return SQLITE_NOMEM_BKPT;
    }
    memcpy(pMem->z, z, nAlloc);
  }else if( xDel==SQLITE_DYNAMIC ){
    sqlite3VdbeMemRelease(pMem);
    pMem->zMalloc = pMem->z = (char *)z;
    pMem->szMalloc = sqlite3DbMallocSize(pMem->db, pMem->zMalloc);
  }else{
    sqlite3VdbeMemRelease(pMem);
    pMem->z = (char *)z;
    pMem->xDel = xDel;
    flags |= ((xDel==SQLITE_STATIC)?MEM_Static:MEM_Dyn);
  }

  pMem->n = nByte;
  pMem->flags = flags;
  pMem->enc = (enc==0 ? SQLITE_UTF8 : enc);

#ifndef SQLITE_OMIT_UTF16
  if( pMem->enc!=SQLITE_UTF8 && sqlite3VdbeMemHandleBom(pMem) ){
    return SQLITE_NOMEM_BKPT;
  }
#endif

  if( nByte>iLimit ){
    return SQLITE_TOOBIG;
  }

  return SQLITE_OK;
}